

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_open(lyout *out,int level,char *elem_prefix,char *elem_name,char *attr_name,
                   char *attr_value,int endflag)

{
  char *pcVar1;
  char *pcVar2;
  
  if (elem_prefix == (char *)0x0) {
    ly_print(out,"%*s<%s",(ulong)(uint)(level * 2),"",elem_name);
  }
  else {
    ly_print(out,"%*s<%s:%s",(ulong)(uint)(level * 2),"");
  }
  if (attr_name != (char *)0x0) {
    ly_print(out," %s=\"",attr_name);
    lyxml_dump_text(out,attr_value);
    pcVar1 = "";
    if (endflag == 1) {
      pcVar1 = ">\n";
    }
    pcVar2 = "/>\n";
    if (endflag != -1) {
      pcVar2 = pcVar1;
    }
    ly_print(out,"\"%s",pcVar2);
    return;
  }
  if (endflag != 0) {
    pcVar1 = ">\n";
    if (endflag == -1) {
      pcVar1 = "/>\n";
    }
    ly_print(out,pcVar1);
    return;
  }
  return;
}

Assistant:

static void
yin_print_open(struct lyout *out, int level, const char *elem_prefix, const char *elem_name,
               const char *attr_name, const char *attr_value, int endflag)
{
    if (elem_prefix) {
        ly_print(out, "%*s<%s:%s", LEVEL, INDENT, elem_prefix, elem_name);
    } else {
        ly_print(out, "%*s<%s", LEVEL, INDENT, elem_name);
    }

    if (attr_name) {
        ly_print(out, " %s=\"", attr_name);
        lyxml_dump_text(out, attr_value);
        ly_print(out, "\"%s", endflag == -1 ? "/>\n" : endflag == 1 ? ">\n" : "");
    } else if (endflag) {
        ly_print(out, endflag == -1 ? "/>\n" : ">\n");
    }
}